

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_requirement.cpp
# Opt level: O2

void __thiscall
ImportRequirement_requirementsEncapsulationUnitsWithChildren_Test::
ImportRequirement_requirementsEncapsulationUnitsWithChildren_Test
          (ImportRequirement_requirementsEncapsulationUnitsWithChildren_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00134048;
  return;
}

Assistant:

TEST(ImportRequirement, requirementsEncapsulationUnitsWithChildren)
{
    const std::vector<std::string> e = {
        "complicatedComponents.cellml",
        "complicatedUnits.cellml",
    };

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("import-requirements/complicatedExample.cellml"));

    auto requirements = model->importRequirements();
    EXPECT_EQ(e, requirements);
}